

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O1

void __thiscall
dg::BBlock<dg::LLVMNode>::BBlock(BBlock<dg::LLVMNode> *this,LLVMNode *head,DependenceGraphT *dg)

{
  size_t *psVar1;
  _Rb_tree_header *p_Var2;
  _List_node_base *p_Var3;
  
  this->key = (KeyT)0x0;
  this->dg = dg;
  (this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->nodes;
  (this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->nodes;
  (this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>._M_impl._M_node.
  _M_size = 0;
  p_Var2 = &(this->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl
            .super__Rb_tree_header;
  (this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var2;
  (this->prevBBs).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  (this->controlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  (this->revControlDeps).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->postDomFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container.
            _M_t._M_impl.super__Rb_tree_header;
  (this->postDomFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->postDomFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t
           ._M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->postDomFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t
           ._M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->postDomFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t
           ._M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  p_Var2 = &(this->postDominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->postDominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->postDominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  (this->postDomFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  this->ipostdom = (BBlock<dg::LLVMNode> *)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->postDominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->postDominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  p_Var2 = &(this->dominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->dominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->dominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  (this->postDominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  this->idom = (BBlock<dg::LLVMNode> *)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->dominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->dominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  (this->dominators).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->domFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
            _M_impl.super__Rb_tree_header;
  (this->domFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->domFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->domFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this->domFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t.
           _M_impl.super__Rb_tree_header._M_header + 0x18) = p_Var2;
  p_Var2 = &(this->callSites)._M_t._M_impl.super__Rb_tree_header;
  (this->callSites)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->callSites)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->domFrontiers).super_DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>.container._M_t._M_impl.
  super__Rb_tree_header._M_node_count = 0;
  this->slice_id = 0;
  this->delete_nodes_on_destr = false;
  (this->callSites)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->callSites)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->analysisAuxData).bfsorder = 0;
  (this->callSites)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->analysisAuxData).lastwalkid = 0;
  (this->analysisAuxData).dfsorder = 0;
  if (head != (LLVMNode *)0x0) {
    (head->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).basicBlock = this;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)head;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

BBlock<NodeT>(NodeT *head = nullptr, DependenceGraphT *dg = nullptr)
            : key(KeyT()), dg(dg), ipostdom(nullptr) {
        if (head) {
            append(head);
            assert(!dg || head->getDG() == nullptr || dg == head->getDG());
        }
    }